

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

void __thiscall Am_Object_Data::sever_copies(Am_Object_Data *this,Am_Slot_Data *proto)

{
  Am_Object_Data *this_00;
  
  proto->field_0x38 = proto->field_0x38 & 0xfe;
  for (this_00 = this->first_instance; this_00 != (Am_Object_Data *)0x0;
      this_00 = this_00->next_instance) {
    sever_slot(this_00,proto);
  }
  return;
}

Assistant:

void
Am_Object_Data::sever_copies(Am_Slot_Data *proto)
{
  proto->flags &= ~BIT_IS_INHERITED;
  Am_Object_Data *current = first_instance;
  while (current) {
    current->sever_slot(proto);
    current = current->next_instance;
  }
}